

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_growstack(lua_State *L,int n,int raiseerror)

{
  int iVar1;
  int local_28;
  int needed;
  int newsize;
  int size;
  int raiseerror_local;
  int n_local;
  lua_State *L_local;
  
  local_28 = (int)((long)(L->stack_last).p - (L->stack).offset >> 4);
  if (local_28 < 0xf4241) {
    if (n < 1000000) {
      local_28 = local_28 << 1;
      iVar1 = (int)((long)(L->top).p - (L->stack).offset >> 4) + n;
      if (1000000 < local_28) {
        local_28 = 1000000;
      }
      if (local_28 < iVar1) {
        local_28 = iVar1;
      }
      if (local_28 < 0xf4241) {
        iVar1 = luaD_reallocstack(L,local_28,raiseerror);
        return iVar1;
      }
    }
    luaD_reallocstack(L,0xf4308,raiseerror);
    if (raiseerror != 0) {
      luaG_runerror(L,"stack overflow");
    }
  }
  else if (raiseerror != 0) {
    luaD_throw(L,5);
  }
  return 0;
}

Assistant:

int luaD_growstack (lua_State *L, int n, int raiseerror) {
  int size = stacksize(L);
  if (l_unlikely(size > LUAI_MAXSTACK)) {
    /* if stack is larger than maximum, thread is already using the
       extra space reserved for errors, that is, thread is handling
       a stack error; cannot grow further than that. */
    lua_assert(stacksize(L) == ERRORSTACKSIZE);
    if (raiseerror)
      luaD_throw(L, LUA_ERRERR);  /* error inside message handler */
    return 0;  /* if not 'raiseerror', just signal it */
  }
  else if (n < LUAI_MAXSTACK) {  /* avoids arithmetic overflows */
    int newsize = 2 * size;  /* tentative new size */
    int needed = cast_int(L->top.p - L->stack.p) + n;
    if (newsize > LUAI_MAXSTACK)  /* cannot cross the limit */
      newsize = LUAI_MAXSTACK;
    if (newsize < needed)  /* but must respect what was asked for */
      newsize = needed;
    if (l_likely(newsize <= LUAI_MAXSTACK))
      return luaD_reallocstack(L, newsize, raiseerror);
  }
  /* else stack overflow */
  /* add extra size to be able to handle the error message */
  luaD_reallocstack(L, ERRORSTACKSIZE, raiseerror);
  if (raiseerror)
    luaG_runerror(L, "stack overflow");
  return 0;
}